

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase130::run(TestCase130 *this)

{
  bool bVar1;
  TestObject *ptrCopy;
  void *firstElement;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  Maybe<kj::Exception> local_4d8;
  NullableValue<kj::Exception> local_340;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0x10;
  firstElement = _::HeapArrayDisposer::allocateImpl
                           (4,0x20,0x20,
                            _::HeapArrayDisposer::Allocate_<kj::(anonymous_namespace)::TestObject>::
                            construct,
                            ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject>::destruct
                           );
  if (firstElement != (void *)0x0) {
    _::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,firstElement,4,0x20,0x20,
               ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject>::destruct);
  }
  local_4d8.ptr.isSet = false;
  Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)&local_340,&local_4d8);
  bVar1 = local_340.isSet;
  Maybe<kj::Exception>::Maybe(&_kjCondition.left,(Maybe<kj::Exception> *)&local_340);
  _kjCondition.right = (None *)&none;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = bVar1;
  if (local_340.isSet == true) {
    Exception::~Exception(&local_340.field_1.value);
  }
  if (local_4d8.ptr.isSet == true) {
    Exception::~Exception(&local_4d8.ptr.field_1.value);
  }
  if ((_kjCondition.result == false) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[95],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x87,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { heapArray<TestObject>(32); }) != kj::none\", _kjCondition"
               ,(char (*) [95])
                "failed: expected ::kj::runCatchingExceptions([&]() { heapArray<TestObject>(32); }) != kj::none"
               ,&_kjCondition);
  }
  if (_kjCondition.left.ptr.isSet == true) {
    Exception::~Exception(&_kjCondition.left.ptr.field_1.value);
  }
  _kjCondition.left.ptr.field_1._24_1_ = (anonymous_namespace)::TestObject::count == 0;
  _kjCondition.left.ptr.isSet = false;
  _kjCondition.left.ptr._1_3_ = 0;
  _kjCondition.left.ptr.field_1.value.ownFile.content.ptr =
       (char *)&(anonymous_namespace)::TestObject::count;
  _kjCondition.left.ptr.field_1.value.ownFile.content.size_ = (size_t)anon_var_dwarf_19d17;
  _kjCondition.left.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)&DAT_00000005;
  if ((!(bool)_kjCondition.left.ptr.field_1._24_1_) && (_::Debug::minSeverity < 3)) {
    local_340.isSet = false;
    local_340._1_3_ = 0;
    _::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x88,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", _kjCondition, 0, TestObject::count"
               ,(char (*) [44])"failed: expected (0) == (TestObject::count)",
               (DebugComparison<int,_int_&> *)&_kjCondition,(int *)&local_340,
               &(anonymous_namespace)::TestObject::count);
  }
  return;
}

Assistant:

TEST(Array, ThrowingConstructor) {
  TestObject::count = 0;
  TestObject::throwAt = 16;

  // If a constructor throws, the previous elements should still be destroyed.
  EXPECT_ANY_THROW(heapArray<TestObject>(32));
  EXPECT_EQ(0, TestObject::count);
}